

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downward_rounding.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3ec9::FlexFloatDownwardRoundingTest_Denormal1Bit_Test::TestBody
          (FlexFloatDownwardRoundingTest_Denormal1Bit_Test *this)

{
  undefined1 uVar1;
  AssertionResult gtest_ar;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> ff_val;
  double val;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *in_stack_000000f8;
  double *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *o;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *this_00;
  string *lhs_expression;
  int line;
  char *in_stack_ffffffffffffff80;
  Type in_stack_ffffffffffffff8c;
  AssertHelper *in_stack_ffffffffffffff90;
  string local_60 [32];
  AssertionResult local_40;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> local_30;
  Message *in_stack_ffffffffffffffe8;
  AssertHelper *this_01;
  
  fesetround(0x400);
  this_01 = (AssertHelper *)0x3fc0000000000000;
  this_00 = (flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *)&stack0xffffffffffffffe0;
  flexfloat<(unsigned_char)'\x03',_(unsigned_char)'\x03'>::flexfloat(this_00);
  o = &local_30;
  flexfloat<(unsigned_char)'\x03',_(unsigned_char)'\x03'>::flexfloat<double>
            ((flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
            );
  flexfloat<(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator=(this_00,o);
  lhs_expression = local_60;
  bitstring<(unsigned_char)3,(unsigned_char)3>(in_stack_000000f8);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)lhs_expression,(char *)this_00,(char (*) [10])o,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  line = (int)((ulong)lhs_expression >> 0x20);
  std::__cxx11::string::~string(local_60);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff90);
    testing::AssertionResult::failure_message((AssertionResult *)0x177f1c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,line,
               (char *)this_00);
    testing::internal::AssertHelper::operator=(this_01,in_stack_ffffffffffffffe8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff60));
    testing::Message::~Message((Message *)0x177f68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x177fa8);
  return;
}

Assistant:

TEST(FlexFloatDownwardRoundingTest, Denormal1Bit) {
    fesetround(FE_DOWNWARD);
    const double val = 0.125;
    flexfloat<3, 3> ff_val;
    ff_val = val;
    EXPECT_EQ("0-000-100", bitstring(ff_val));
}